

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

bool Hex::Hexdumper<unsigned_int>::data_is_equal<std::pair<unsigned_int_const*,unsigned_int_const*>>
               (pair<const_unsigned_int_*,_const_unsigned_int_*> *a,
               pair<const_unsigned_int_*,_const_unsigned_int_*> *b)

{
  uint *__s1;
  uint *puVar1;
  uint *__s2;
  int iVar2;
  bool bVar3;
  
  __s1 = a->first;
  puVar1 = a->second;
  __s2 = b->first;
  bVar3 = true;
  if (puVar1 != b->second || __s1 != __s2) {
    if ((long)puVar1 - (long)__s1 != (long)b->second - (long)__s2) {
      return false;
    }
    if (puVar1 != __s1) {
      iVar2 = bcmp(__s1,__s2,(long)puVar1 - (long)__s1);
      bVar3 = iVar2 == 0;
    }
  }
  return bVar3;
}

Assistant:

static bool data_is_equal(const PAIR& a, const PAIR& b)
    {
        if (a==b)
            return true;
        if (a.second-a.first != b.second-b.first)
            return false;
        return std::equal(a.first, a.second, b.first);
    }